

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O3

URI * __thiscall URI::operator=(URI *this,char *uri)

{
  char *pcVar1;
  
  clear(this);
  pcVar1 = (char *)(this->mFullString)._M_string_length;
  strlen(uri);
  std::__cxx11::string::_M_replace((ulong)&this->mFullString,0,pcVar1,(ulong)uri);
  parseString(this);
  return this;
}

Assistant:

const URI &URI::operator=( const char *uri ) 
{
	clear();
	mFullString = uri;
	parseString();
	return *this;
}